

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O0

void WebRtcIsac_AutoCorr(double *r,double *x,size_t N,size_t order)

{
  double *x_lag;
  double prod;
  double sum;
  size_t n;
  size_t lag;
  size_t order_local;
  size_t N_local;
  double *x_local;
  double *r_local;
  
  for (n = 0; n <= order; n = n + 1) {
    prod = 0.0;
    x_lag = (double *)(*x * x[n]);
    for (sum = 4.94065645841247e-324; (ulong)sum < N - n; sum = (double)((long)sum + 1)) {
      prod = (double)x_lag + prod;
      x_lag = (double *)(x[(long)sum] * (x + n)[(long)sum]);
    }
    r[n] = (double)x_lag + prod;
  }
  return;
}

Assistant:

void WebRtcIsac_AutoCorr(double* r, const double* x, size_t N, size_t order) {
  size_t  lag, n;
  double sum, prod;
  const double *x_lag;

  for (lag = 0; lag <= order; lag++)
  {
    sum = 0.0f;
    x_lag = &x[lag];
    prod = x[0] * x_lag[0];
    for (n = 1; n < N - lag; n++) {
      sum += prod;
      prod = x[n] * x_lag[n];
    }
    sum += prod;
    r[lag] = sum;
  }

}